

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg_test.cc
# Opt level: O0

void __thiscall anon_unknown.dwarf_fe241b::SatdTest::SatdTest(SatdTest *this)

{
  SatdTestParam<int_(*)(const_int_*,_int)> *in_RDI;
  SatdTestBase<int,_int_(*)(const_int_*,_int)> *unaff_retaddr;
  SatdTestParam<int_(*)(const_int_*,_int)> *func_param;
  
  func_param = in_RDI;
  testing::WithParamInterface<(anonymous_namespace)::SatdTestParam<int_(*)(const_int_*,_int)>_>::
  GetParam();
  SatdTestBase<int,_int_(*)(const_int_*,_int)>::SatdTestBase(unaff_retaddr,func_param);
  *(undefined ***)in_RDI = &PTR__SatdTest_01f974b8;
  in_RDI->func_simd = (_func_int_int_ptr_int *)&PTR__SatdTest_01f974f8;
  return;
}

Assistant:

SatdTest() : SatdTestBase(GetParam()) {}